

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O1

LP * fizplex::MPSReader::read_lp(LP *__return_storage_ptr__,string *mps_file)

{
  Row row;
  _Alloc_hider __nptr;
  char cVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  iterator iVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  long lVar8;
  int *piVar9;
  runtime_error *prVar10;
  string var_name;
  string first_word;
  string obj_name;
  string row_name;
  string current_section;
  string line;
  index_map vars;
  index_map rows;
  istringstream iss;
  ifstream ifs;
  string local_530;
  double local_510;
  string local_508;
  undefined1 *local_4e8;
  size_t local_4e0;
  undefined1 local_4d8;
  undefined7 uStack_4d7;
  string local_4c8;
  undefined1 *local_4a8;
  size_t local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_478;
  undefined7 uStack_477;
  string local_468;
  char *local_448;
  Row local_440;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_428;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  long local_398;
  long local_390;
  ios_base local_340 [264];
  long local_238 [65];
  
  LP::LP(__return_storage_ptr__);
  std::ifstream::ifstream(local_238,(string *)mps_file,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_3b8,"Couldn\'t open file ",mps_file);
    std::runtime_error::runtime_error(prVar10,(string *)&local_3b8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_488 = &local_478;
  local_480 = 0;
  local_478 = 0;
  local_4a8 = &local_498;
  local_4a0 = 0;
  local_498 = 0;
  local_3f0._M_buckets = &local_3f0._M_single_bucket;
  local_3f0._M_bucket_count = 1;
  local_3f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_3f0._M_element_count = 0;
  local_3f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_3f0._M_rehash_policy._M_next_resize = 0;
  local_3f0._M_single_bucket = (__node_base_ptr)0x0;
  local_428._M_buckets = &local_428._M_single_bucket;
  local_428._M_bucket_count = 1;
  local_428._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_428._M_element_count = 0;
  local_428._M_rehash_policy._M_max_load_factor = 1.0;
  local_428._M_rehash_policy._M_next_resize = 0;
  local_428._M_single_bucket = (__node_base_ptr)0x0;
  local_4e8 = &local_4d8;
  local_4e0 = 0;
  local_4d8 = 0;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_488,cVar1);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8,CONCAT71(uStack_4d7,local_4d8) + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_428);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_3f0);
      if (local_4a8 != &local_498) {
        operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
      }
      if (local_488 != &local_478) {
        operator_delete(local_488,CONCAT71(uStack_477,local_478) + 1);
      }
      std::ifstream::~ifstream(local_238);
      return __return_storage_ptr__;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_3b8,(string *)&local_488,_S_in);
    next_word(&local_508,(istringstream *)&local_3b8);
    bVar2 = is_indicator(&local_508);
    if ((bVar2) &&
       ((local_4a0 != local_508._M_string_length ||
        ((local_4a0 != 0 &&
         (iVar3 = bcmp(local_4a8,local_508._M_dataplus._M_p,local_4a0), iVar3 != 0)))))) {
      std::__cxx11::string::_M_assign((string *)&local_4a8);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_4a8);
      if (iVar3 == 0) {
        next_word(&local_530,(istringstream *)&local_3b8);
        iVar3 = std::__cxx11::string::compare((char *)&local_508);
        if ((iVar3 == 0) && (local_4e0 == 0)) {
          std::__cxx11::string::_M_assign((string *)&local_4e8);
        }
        else {
          parse_row_type(&local_440,&local_508);
          row.lower = local_440.lower;
          row.type = local_440.type;
          row._4_4_ = local_440._4_4_;
          row.upper = local_440.upper;
          LP::add_row(__return_storage_ptr__,row);
          if (local_530._M_string_length == 0) {
LAB_00177c7d:
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar10,"Row name is empty");
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar6 = LP::row_count(__return_storage_ptr__);
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_3f0,&local_530);
          *pmVar7 = sVar6 - 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_4a8);
        if (iVar3 == 0) {
          parse_and_add_rhs(&local_508,(istringstream *)&local_3b8,(index_map *)&local_3f0,
                            __return_storage_ptr__);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_4a8);
          if (iVar3 == 0) {
            local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_530,local_508._M_dataplus._M_p,
                       local_508._M_dataplus._M_p + local_508._M_string_length);
            iVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&local_428,&local_530);
            if (iVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              LP::add_column(__return_storage_ptr__,LowerBound,0.0,INFINITY,0.0);
              sVar6 = LP::column_count(__return_storage_ptr__);
              pmVar7 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&local_428,&local_530);
              *pmVar7 = sVar6 - 1;
            }
            while( true ) {
              lVar8 = local_390 - local_398;
              if (lVar8 == 0) {
                lVar8 = (**(code **)(local_3b8.field_2._M_allocated_capacity + 0x38))
                                  (&local_3b8.field_2);
              }
              if (lVar8 < 1) break;
              next_word(&local_4c8,(istringstream *)&local_3b8);
              next_word(&local_468,(istringstream *)&local_3b8);
              __nptr._M_p = local_468._M_dataplus._M_p;
              piVar9 = __errno_location();
              iVar3 = *piVar9;
              *piVar9 = 0;
              local_510 = strtod(__nptr._M_p,&local_448);
              if (local_448 == __nptr._M_p) {
                std::__throw_invalid_argument("stod");
LAB_00177c71:
                std::__throw_out_of_range("stod");
                goto LAB_00177c7d;
              }
              if (*piVar9 == 0) {
                *piVar9 = iVar3;
              }
              else if (*piVar9 == 0x22) goto LAB_00177c71;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_468._M_dataplus._M_p != &local_468.field_2) {
                operator_delete(local_468._M_dataplus._M_p,
                                local_468.field_2._M_allocated_capacity + 1);
              }
              if ((local_4c8._M_string_length == local_4e0) &&
                 ((local_4c8._M_string_length == 0 ||
                  (iVar3 = bcmp(local_4c8._M_dataplus._M_p,local_4e8,local_4c8._M_string_length),
                  iVar3 == 0)))) {
                pmVar7 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_428,&local_530);
                LP::add_obj_value(__return_storage_ptr__,*pmVar7,local_510);
              }
              else {
                pmVar7 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_3f0,&local_4c8);
                sVar6 = *pmVar7;
                pmVar7 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_428,&local_530);
                LP::add_value(__return_storage_ptr__,sVar6,*pmVar7,local_510);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                local_4c8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_3b8);
    std::ios_base::~ios_base(local_340);
  } while( true );
}

Assistant:

LP read_lp(std::string mps_file) {
  LP lp;
  std::ifstream ifs(mps_file);
  if (!ifs.is_open())
    throw std::runtime_error("Couldn't open file " + mps_file);
  std::string line, current_section;
  index_map rows, vars;
  std::string obj_name;
  while (std::getline(ifs, line)) {
    std::istringstream iss(line);
    const auto first_word = next_word(iss);
    if (is_indicator(first_word) && current_section != first_word)
      current_section = first_word;
    else { // Data record
      if (current_section == "ROWS") {
        const std::string row_name = next_word(iss);
        if (first_word == "N" && obj_name.empty())
          obj_name = row_name;
        else {
          lp.add_row(parse_row_type(first_word));
          if (!row_name.empty())
            rows[row_name] = lp.row_count() - 1;
          else
            throw std::runtime_error("Row name is empty");
        }
      } else if (current_section == "RHS")
        parse_and_add_rhs(first_word, iss, rows, lp);
      else if (current_section == "COLUMNS") {
        const std::string var_name = first_word;
        if (vars.find(var_name) == vars.end()) {
          lp.add_column(ColType::LowerBound, 0, inf);
          vars[var_name] = lp.column_count() - 1;
        }
        while (iss.rdbuf()->in_avail() > 0) {
          const std::string row_name = next_word(iss);
          const auto val = std::stod(next_word(iss));
          if (row_name == obj_name)
            lp.add_obj_value(vars[var_name], val);
          else
            lp.add_value(rows[row_name], vars[var_name], val);
        }
      }
    }
  }
  return lp;
}